

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O2

void __thiscall duckdb::ColumnCountScanner::FinalizeChunkProcess(ColumnCountScanner *this)

{
  CSVIterator *__k;
  CSVStates *this_00;
  ColumnCountResult *result;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_01;
  CSVState CVar1;
  __pthread_internal_list *p_Var2;
  __pthread_internal_list *p_Var3;
  CSVReaderOptions *this_02;
  bool bVar4;
  CSVBufferHandle *pCVar5;
  CSVBufferManager *pos;
  mapped_type *this_03;
  idx_t iVar6;
  data_ptr_t pdVar7;
  CSVErrorHandler *this_04;
  LinesPerBoundary error_info;
  string *in_stack_fffffffffffffeb0;
  bool mock;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>
  *local_140;
  LinePosition *local_138;
  shared_ptr<duckdb::CSVBufferManager,_true> *local_130;
  LinesPerBoundary lines_per_batch;
  string csv_row;
  CSVError error;
  undefined1 local_68 [56];
  
  if (((this->result).result_position == (this->result).super_ScannerResult.result_size) ||
     ((this->result).error != false)) {
    return;
  }
  result = &this->result;
  __k = &(this->super_BaseScanner).iterator;
  this_01 = &(this->super_BaseScanner).cur_buffer_handle;
  local_130 = &(this->super_BaseScanner).buffer_manager;
  local_140 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>
               *)&(this->result).buffer_handles;
  local_138 = &(this->result).super_ScannerResult.last_position;
  do {
    bVar4 = BaseScanner::FinishedFile(&this->super_BaseScanner);
    if (bVar4) {
      return;
    }
    if ((this->result).super_ScannerResult.result_size <= (this->result).result_position) {
      return;
    }
    if ((this->result).error != false) {
      return;
    }
    iVar6 = (this->super_BaseScanner).iterator.pos.buffer_pos;
    pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
    if (iVar6 == pCVar5->actual_size) {
      pos = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(local_130);
      (__k->pos).buffer_idx = (__k->pos).buffer_idx + 1;
      CSVBufferManager::GetBuffer((CSVBufferManager *)&error,(idx_t)pos);
      shared_ptr<duckdb::CSVBufferHandle,_true>::operator=
                (this_01,(shared_ptr<duckdb::CSVBufferHandle,_true> *)&error);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&error.error_message._M_string_length
                );
      if ((this_01->internal).
          super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        (this->super_BaseScanner).buffer_handle_ptr = (char *)0x0;
        this_00 = &(this->super_BaseScanner).states;
        CVar1 = (this->super_BaseScanner).states.states[1];
        if (((CVar1 == QUOTED_NEW_LINE) || (CVar1 == QUOTED)) && (this_00->states[0] != UNQUOTED)) {
          (this->result).error = true;
          return;
        }
        bVar4 = CSVStates::EmptyLine(this_00);
        if (bVar4) {
          return;
        }
        CVar1 = (this->super_BaseScanner).states.states[1];
        if ((byte)((this->super_BaseScanner).states.states[0] - QUOTED) < 0xfe &&
            (byte)(CVar1 - RECORD_SEPARATOR) < 2) {
          return;
        }
        if ((CVar1 < 0xc) && ((0x860U >> (CVar1 & 0x1f) & 1) != 0)) {
          return;
        }
        if ((this->result).super_ScannerResult.comment == true) {
          ColumnCountResult::UnsetComment(result,0xffffffffffffffff);
          return;
        }
        ColumnCountResult::AddRow(result,0xffffffffffffffff);
        return;
      }
      this_03 = ::std::
                map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                ::operator[]((map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                              *)local_140,(key_type *)__k);
      shared_ptr<duckdb::CSVBufferHandle,_true>::operator=(this_03,this_01);
      (this->result).cur_buffer_idx = (this->super_BaseScanner).iterator.pos.buffer_idx;
      pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
      p_Var2 = (__pthread_internal_list *)pCVar5->actual_size;
      (this->result).current_buffer_size = (idx_t)p_Var2;
      p_Var3 = (__pthread_internal_list *)(this->result).cur_buffer_idx;
      LinesPerBoundary::LinesPerBoundary(&lines_per_batch);
      if ((__pthread_internal_list *)(this->result).super_ScannerResult.last_position.buffer_idx ==
          p_Var3) {
        iVar6 = 0;
      }
      else {
        iVar6 = (this->result).super_ScannerResult.last_position.buffer_size;
      }
      if ((((this->result).super_ScannerResult.state_machine)->options->maximum_line_size).value <
          iVar6 - (this->result).super_ScannerResult.last_position.buffer_pos) {
        local_68._16_8_ = local_138->buffer_idx;
        local_68._0_8_ = local_138->buffer_pos;
        local_68._8_8_ = local_138->buffer_size;
        local_68._24_8_ = 0;
        mock = false;
        local_68._32_8_ = p_Var2;
        local_68._40_8_ = p_Var3;
        FullLinePosition::
        ReconstructCurrentLine<std::map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                  (&csv_row,(FullLinePosition *)local_68,&mock,
                   (map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                    *)local_140,true);
        this_02 = ((this->result).super_ScannerResult.state_machine)->options;
        error_info.lines_in_batch = (idx_t)&csv_row;
        error_info.boundary_idx = lines_per_batch.lines_in_batch;
        CSVError::LineSizeError
                  (&error,(CSVError *)this_02,(CSVReaderOptions *)lines_per_batch.boundary_idx,
                   error_info,
                   (string *)
                   ((this->result).super_ScannerResult.last_position.buffer_idx *
                    (this_02->buffer_size_option).value +
                   (this->result).super_ScannerResult.last_position.buffer_pos),
                   (idx_t)&this_02->file_path,in_stack_fffffffffffffeb0);
        this_04 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                            (&(this->super_BaseScanner).error_handler);
        CSVErrorHandler::Error(this_04,&error,false);
        (this->result).error = true;
        CSVError::~CSVError(&error);
        ::std::__cxx11::string::~string((string *)&csv_row);
        return;
      }
      if (2 < (this->result).buffer_handles._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        ::std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>
        ::erase_abi_cxx11_(local_140,
                           (this->result).buffer_handles._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_left);
      }
      (this->super_BaseScanner).iterator.pos.buffer_pos = 0;
      pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
      pdVar7 = BufferHandle::Ptr(&pCVar5->handle);
      (this->super_BaseScanner).buffer_handle_ptr = (char *)pdVar7;
    }
    BaseScanner::Process<duckdb::ColumnCountResult>(&this->super_BaseScanner,result);
  } while( true );
}

Assistant:

void ColumnCountScanner::FinalizeChunkProcess() {
	if (result.result_position == result.result_size || result.error) {
		// We are done
		return;
	}
	// We run until we have a full chunk, or we are done scanning
	while (!FinishedFile() && result.result_position < result.result_size && !result.error) {
		if (iterator.pos.buffer_pos == cur_buffer_handle->actual_size) {
			// Move to next buffer
			cur_buffer_handle = buffer_manager->GetBuffer(++iterator.pos.buffer_idx);

			if (!cur_buffer_handle) {
				buffer_handle_ptr = nullptr;
				if (states.IsQuotedCurrent() && !states.IsUnquoted()) {
					// We are finishing our file on a quoted value that is never unquoted, straight to jail.
					result.error = true;
					return;
				}
				if (states.EmptyLine() || states.NewRow() || states.IsCurrentNewRow() || states.IsNotSet()) {
					return;
				}
				// This means we reached the end of the file, we must add a last line if there is any to be added
				if (result.comment) {
					// If it's a comment we add the last line via unset comment
					result.UnsetComment(result, NumericLimits<idx_t>::Maximum());
				} else {
					// OW, we do a regular AddRow
					result.AddRow(result, NumericLimits<idx_t>::Maximum());
				}
				return;
			} else {
				result.buffer_handles[iterator.pos.buffer_idx] = cur_buffer_handle;
				result.cur_buffer_idx = iterator.pos.buffer_idx;
				result.current_buffer_size = cur_buffer_handle->actual_size;
				// Do a quick check that the line is still sane
				const LinePosition cur_position(result.cur_buffer_idx, 0, result.current_buffer_size);
				LinesPerBoundary lines_per_batch;
				if (cur_position - result.last_position > result.state_machine.options.maximum_line_size.GetValue()) {
					FullLinePosition current_line_position;
					current_line_position.begin = result.last_position;
					current_line_position.end = cur_position;
					bool mock = false;
					string csv_row = current_line_position.ReconstructCurrentLine(mock, result.buffer_handles, true);
					auto error =
					    CSVError::LineSizeError(result.state_machine.options, lines_per_batch, csv_row,
					                            result.last_position.GetGlobalPosition(
					                                result.state_machine.options.buffer_size_option.GetValue(), false),
					                            result.state_machine.options.file_path);
					error_handler->Error(error);
					result.error = true;
					return;
				}
			}
			if (result.buffer_handles.size() > 2) {
				// pop lowest value
				result.buffer_handles.erase(result.buffer_handles.begin());
			}
			iterator.pos.buffer_pos = 0;
			buffer_handle_ptr = cur_buffer_handle->Ptr();
		}
		Process(result);
	}
}